

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O0

Reals Omega_h::inertia::anon_unknown_0::get_distances(Reals *coords,Vector<3> center,Vector<3> axis)

{
  int size_in;
  void *extraout_RDX;
  Read<double> *in_RSI;
  Reals RVar1;
  Write<double> local_e8;
  undefined1 local_d8 [8];
  type f;
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  Write<double> distances;
  int n;
  Reals *coords_local;
  ulong local_10;
  
  if (((ulong)(in_RSI->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((in_RSI->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(in_RSI->write_).shared_alloc_.alloc >> 3;
  }
  size_in = divide_no_remainder<int>((int)(local_10 >> 3),3);
  distances.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  Write<double>::Write((Write<double> *)local_50,size_in,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  Write<double>::Write((Write<double> *)local_d8,(Write<double> *)local_50);
  Read<double>::Read((Read<double> *)&f.distances.shared_alloc_.direct_ptr,in_RSI);
  f.center.super_Few<double,_3>.array_[1] = center.super_Few<double,_3>.array_[2];
  f.coords.write_.shared_alloc_.direct_ptr = (void *)center.super_Few<double,_3>.array_[0];
  f.center.super_Few<double,_3>.array_[0] = center.super_Few<double,_3>.array_[1];
  f.axis.super_Few<double,_3>.array_[1] = axis.super_Few<double,_3>.array_[2];
  f.center.super_Few<double,_3>.array_[2] = axis.super_Few<double,_3>.array_[0];
  f.axis.super_Few<double,_3>.array_[0] = axis.super_Few<double,_3>.array_[1];
  parallel_for<Omega_h::inertia::(anonymous_namespace)::get_distances(Omega_h::Read<double>,Omega_h::Vector<3>,Omega_h::Vector<3>)::__0>
            (distances.shared_alloc_.direct_ptr._4_4_,(type *)local_d8,"get_distances");
  Write<double>::Write(&local_e8,(Write<signed_char> *)local_50);
  Read<double>::Read(coords,&local_e8);
  Write<double>::~Write(&local_e8);
  (anonymous_namespace)::get_distances(Omega_h::Read<double>,Omega_h::Vector<3>,Omega_h::Vector<3>)
  ::$_0::~__0((__0 *)local_d8);
  Write<double>::~Write((Write<double> *)local_50);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)coords;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals get_distances(Reals coords, Vector<3> center, Vector<3> axis) {
  auto n = divide_no_remainder(coords.size(), 3);
  Write<Real> distances(n);
  auto f = OMEGA_H_LAMBDA(LO i) {
    distances[i] = (get_vector<3>(coords, i) - center) * axis;
  };
  parallel_for(n, f, "get_distances");
  return distances;
}